

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Generators::GeneratorTracker::~GeneratorTracker(GeneratorTracker *this)

{
  GeneratorUntypedBase *pGVar1;
  pointer pcVar2;
  
  (this->super_TrackerBase).super_ITracker._vptr_ITracker =
       (_func_int **)&PTR__GeneratorTracker_001a1380;
  (this->super_IGeneratorTracker)._vptr_IGeneratorTracker =
       (_func_int **)&PTR__GeneratorTracker_001a1428;
  pGVar1 = (this->m_generator)._M_t.
           super___uniq_ptr_impl<Catch::Generators::GeneratorUntypedBase,_std::default_delete<Catch::Generators::GeneratorUntypedBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::Generators::GeneratorUntypedBase_*,_std::default_delete<Catch::Generators::GeneratorUntypedBase>_>
           .super__Head_base<0UL,_Catch::Generators::GeneratorUntypedBase_*,_false>._M_head_impl;
  if (pGVar1 != (GeneratorUntypedBase *)0x0) {
    (*pGVar1->_vptr_GeneratorUntypedBase[1])();
  }
  (this->m_generator)._M_t.
  super___uniq_ptr_impl<Catch::Generators::GeneratorUntypedBase,_std::default_delete<Catch::Generators::GeneratorUntypedBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::GeneratorUntypedBase_*,_std::default_delete<Catch::Generators::GeneratorUntypedBase>_>
  .super__Head_base<0UL,_Catch::Generators::GeneratorUntypedBase_*,_false>._M_head_impl =
       (GeneratorUntypedBase *)0x0;
  (this->super_TrackerBase).super_ITracker._vptr_ITracker = (_func_int **)&PTR__TrackerBase_001a1690
  ;
  clara::std::
  vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::~vector(&(this->super_TrackerBase).m_children);
  (this->super_TrackerBase).super_ITracker._vptr_ITracker = (_func_int **)&PTR__ITracker_001a1600;
  pcVar2 = (this->super_TrackerBase).super_ITracker.m_nameAndLocation.name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_TrackerBase).super_ITracker.m_nameAndLocation.name.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

GeneratorTracker::~GeneratorTracker() {}